

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

void Abc_NtkPermutePiUsingFanout(Abc_Ntk_t *pNtk)

{
  void *Entry;
  int i;
  
  qsort(pNtk->vPis->pArray,(long)pNtk->vPis->nSize,8,Abc_NodeCompareByFanoutCount);
  pNtk->vCis->nSize = 0;
  for (i = 0; i < pNtk->vPis->nSize; i = i + 1) {
    Entry = Vec_PtrEntry(pNtk->vPis,i);
    Vec_PtrPush(pNtk->vCis,Entry);
  }
  return;
}

Assistant:

void Abc_NtkPermutePiUsingFanout( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode; int i;
    qsort( (void *)Vec_PtrArray(pNtk->vPis), Vec_PtrSize(pNtk->vPis), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareByFanoutCount );
    Vec_PtrClear( pNtk->vCis );
    Vec_PtrForEachEntry( Abc_Obj_t *, pNtk->vPis, pNode, i )
        Vec_PtrPush( pNtk->vCis, pNode );
}